

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<double>,_10>::Resize
          (TPZManVector<TPZEqnArray<double>,_10> *this,int64_t newsize)

{
  undefined1 *puVar1;
  TPZEqnArray<double> *pTVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong *puVar5;
  int64_t i;
  long lVar6;
  TPZEqnArray<double> *pTVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int64_t i_1;
  ulong uVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar10 = (this->super_TPZVec<TPZEqnArray<double>_>).fNElements;
    if (lVar10 != newsize) {
      lVar6 = (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc;
      if (lVar6 < newsize) {
        if ((ulong)newsize < 0xb) {
          puVar1 = &this->field_0x20;
          if ((this->super_TPZVec<TPZEqnArray<double>_>).fStore != (TPZEqnArray<double> *)puVar1) {
            lVar9 = 0;
            for (lVar6 = 0; pTVar2 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore,
                lVar6 < lVar10; lVar6 = lVar6 + 1) {
              TPZEqnArray<double>::operator=
                        ((TPZEqnArray<double> *)(puVar1 + lVar9),
                         (TPZEqnArray<double> *)
                         ((long)(pTVar2->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                         lVar9 + -0x28));
              lVar10 = (this->super_TPZVec<TPZEqnArray<double>_>).fNElements;
              lVar9 = lVar9 + 0x3290;
            }
            if (pTVar2 != (TPZEqnArray<double> *)0x0) {
              lVar10 = *(long *)&pTVar2[-1].fLastTerm;
              if (lVar10 != 0) {
                lVar6 = lVar10 * 0x3290;
                do {
                  TPZEqnArray<double>::~TPZEqnArray
                            ((TPZEqnArray<double> *)
                             ((long)pTVar2[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                             lVar6 + -0x28));
                  lVar6 = lVar6 + -0x3290;
                } while (lVar6 != 0);
              }
              operator_delete__(&pTVar2[-1].fLastTerm,lVar10 * 0x3290 | 8);
            }
            (this->super_TPZVec<TPZEqnArray<double>_>).fStore = (TPZEqnArray<double> *)puVar1;
          }
          (this->super_TPZVec<TPZEqnArray<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = 0;
        }
        else {
          dVar12 = (double)lVar6 * 1.2;
          uVar11 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar11 = newsize;
          }
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar11;
          uVar8 = 0xffffffffffffffff;
          if (SUB168(auVar3 * ZEXT816(0x3290),8) == 0) {
            uVar8 = SUB168(auVar3 * ZEXT816(0x3290),0) | 8;
          }
          puVar5 = (ulong *)operator_new__(uVar8);
          *puVar5 = uVar11;
          pTVar2 = (TPZEqnArray<double> *)(puVar5 + 1);
          if (uVar11 != 0) {
            lVar10 = 0;
            pTVar7 = pTVar2;
            do {
              TPZEqnArray<double>::TPZEqnArray(pTVar7);
              lVar10 = lVar10 + -0x3290;
              pTVar7 = pTVar7 + 1;
            } while (uVar11 * -0x3290 - lVar10 != 0);
          }
          lVar10 = 0;
          for (lVar6 = 0; pTVar7 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore,
              lVar6 < (this->super_TPZVec<TPZEqnArray<double>_>).fNElements; lVar6 = lVar6 + 1) {
            TPZEqnArray<double>::operator=
                      ((TPZEqnArray<double> *)
                       ((long)(pTVar2->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar10 + -0x28),
                       (TPZEqnArray<double> *)
                       ((long)(pTVar7->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar10 + -0x28));
            lVar10 = lVar10 + 0x3290;
          }
          if (pTVar7 != (TPZEqnArray<double> *)0x0 &&
              pTVar7 != (TPZEqnArray<double> *)&this->field_0x20) {
            lVar10 = *(long *)&pTVar7[-1].fLastTerm;
            if (lVar10 != 0) {
              lVar6 = lVar10 * 0x3290;
              do {
                TPZEqnArray<double>::~TPZEqnArray
                          ((TPZEqnArray<double> *)
                           ((long)pTVar7[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                           lVar6 + -0x28));
                lVar6 = lVar6 + -0x3290;
              } while (lVar6 != 0);
            }
            operator_delete__(&pTVar7[-1].fLastTerm,lVar10 * 0x3290 | 8);
          }
          (this->super_TPZVec<TPZEqnArray<double>_>).fStore = pTVar2;
          (this->super_TPZVec<TPZEqnArray<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = uVar11;
        }
      }
      else {
        (this->super_TPZVec<TPZEqnArray<double>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}